

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O3

void basisu::vector<basist::ktx2_transcoder::key_value>::object_mover
               (void *pDst_void,void *pSrc_void,uint32_t num)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  
  if (num != 0) {
    lVar3 = 0;
    do {
      ((elemental_vector *)pDst_void)->m_p = (void *)0x0;
      ((elemental_vector *)pDst_void)->m_size = 0;
      ((elemental_vector *)pDst_void)->m_capacity = 0;
      elemental_vector::increase_capacity
                ((elemental_vector *)pDst_void,*(uint32_t *)((long)pSrc_void + lVar3 + 8),false,1,
                 (object_mover)0x0,false);
      uVar1 = *(uint *)((long)pSrc_void + lVar3 + 8);
      ((elemental_vector *)pDst_void)->m_size = uVar1;
      if ((((elemental_vector *)pDst_void)->m_p != (void *)0x0) &&
         (*(void **)((long)pSrc_void + lVar3) != (void *)0x0)) {
        memcpy(((elemental_vector *)pDst_void)->m_p,*(void **)((long)pSrc_void + lVar3),(ulong)uVar1
              );
      }
      ((elemental_vector *)((long)pDst_void + 0x10))->m_p = (void *)0x0;
      ((elemental_vector *)((long)pDst_void + 0x10))->m_size = 0;
      ((elemental_vector *)((long)pDst_void + 0x10))->m_capacity = 0;
      elemental_vector::increase_capacity
                ((elemental_vector *)((long)pDst_void + 0x10),
                 *(uint32_t *)((long)pSrc_void + lVar3 + 0x18),false,1,(object_mover)0x0,false);
      uVar1 = *(uint *)((long)pSrc_void + lVar3 + 0x18);
      ((elemental_vector *)((long)pDst_void + 0x10))->m_size = uVar1;
      if (((elemental_vector *)((long)pDst_void + 0x10))->m_p == (void *)0x0) {
LAB_001540ec:
        pvVar2 = *(void **)((long)pSrc_void + lVar3 + 0x10);
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
      }
      else {
        pvVar2 = *(void **)((long)pSrc_void + lVar3 + 0x10);
        if (pvVar2 != (void *)0x0) {
          memcpy(((elemental_vector *)((long)pDst_void + 0x10))->m_p,pvVar2,(ulong)uVar1);
          goto LAB_001540ec;
        }
      }
      if (*(void **)((long)pSrc_void + lVar3) != (void *)0x0) {
        free(*(void **)((long)pSrc_void + lVar3));
      }
      pDst_void = (void *)((long)pDst_void + 0x20);
      lVar3 = lVar3 + 0x20;
    } while ((ulong)num << 5 != lVar3);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint32_t num)
      {
         T* pSrc = static_cast<T*>(pSrc_void);
         T* const pSrc_end = pSrc + num;
         T* pDst = static_cast<T*>(pDst_void);

         while (pSrc != pSrc_end)
         {
            // placement new
            new (static_cast<void*>(pDst)) T(*pSrc);
            pSrc->~T();
            ++pSrc;
            ++pDst;
         }
      }